

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O2

void __thiscall
ft::vector<int,_ft::allocator<int>_>::insert
          (vector<int,_ft::allocator<int>_> *this,iterator position,size_type n,
          value_type_conflict *val)

{
  size_type sVar1;
  iterator piVar2;
  value_type_conflict *val_00;
  bool bVar3;
  value_type_conflict *local_50;
  vector<int,_ft::allocator<int>_> tmp;
  
  vector<int,ft::allocator<int>>::vector<int*>
            ((vector<int,ft::allocator<int>> *)&local_50,position,this->m_data + this->m_size,
             (allocator_type *)&tmp.field_0x1f,(type *)0x0);
  sVar1 = this->m_size;
  for (piVar2 = this->m_data + sVar1; sVar1 = sVar1 - 1, piVar2 != position; piVar2 = piVar2 + -1) {
    this->m_size = sVar1;
  }
  while (bVar3 = n != 0, n = n - 1, val_00 = local_50, bVar3) {
    push_back(this,val);
  }
  for (; val_00 != local_50 + (long)tmp.m_data; val_00 = val_00 + 1) {
    push_back(this,val_00);
  }
  operator_delete(local_50);
  return;
}

Assistant:

void        insert(iterator position, size_type n, value_type const & val) {
		vector	tmp(position, this->end());
		while (position != this->end())
			this->pop_back();
		for (size_type i = 0; i < n; ++i)
			this->push_back(val);
		for (iterator it = tmp.begin(); it != tmp.end(); ++it)
			this->push_back(*it);
	}